

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec.h
# Opt level: O0

void __thiscall bandit::reporter::spec::test_run_complete(spec *this)

{
  spec *this_local;
  
  progress_base::test_run_complete((progress_base *)this);
  std::ostream::operator<<((this->super_colored_base).stm_,std::endl<char,std::char_traits<char>>);
  summary::write((int)(this->super_colored_base).stm_,
                 (void *)(ulong)(uint)(this->super_colored_base).super_progress_base.specs_run_,
                 (ulong)(uint)(this->super_colored_base).super_progress_base.specs_failed_);
  std::ostream::flush();
  return;
}

Assistant:

void test_run_complete() override {
        progress_base::test_run_complete();

        stm_ << std::endl;

        summary::write(stm_, specs_run_, specs_failed_, specs_succeeded_, specs_skipped_, failures_,
            test_run_errors_, colorizer_);
        stm_.flush();
      }